

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSimplexAnalysis.cpp
# Opt level: O3

void __thiscall HighsSimplexAnalysis::reportIterationData(HighsSimplexAnalysis *this,bool header)

{
  undefined7 in_register_00000031;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  string local_38;
  
  if ((int)CONCAT71(in_register_00000031,header) == 0) {
    pbVar1 = (this->analysis_log)._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl + 0x10;
    if (-1 < this->pivotal_row_index) {
      highsFormatToString_abi_cxx11_
                (&local_38," %7d %7d %7d",(ulong)(uint)this->entering_variable,
                 (ulong)(uint)this->leaving_variable);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pbVar1,local_38._M_dataplus._M_p,local_38._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p);
      }
      pbVar1 = (this->analysis_log)._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl + 0x10;
      if (this->entering_variable < 0) {
        highsFormatToString_abi_cxx11_
                  (&local_38,"                         %11.4g                        ",
                   this->primal_delta);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pbVar1,local_38._M_dataplus._M_p,local_38._M_string_length);
      }
      else {
        highsFormatToString_abi_cxx11_
                  (&local_38," %11.4g %11.4g %11.4g %11.4g %11.4g",this->dual_step,this->primal_step
                   ,this->primal_delta,this->numerical_trouble,this->pivot_value_from_column);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pbVar1,local_38._M_dataplus._M_p,local_38._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p == &local_38.field_2) {
        return;
      }
      goto LAB_0036107d;
    }
    highsFormatToString_abi_cxx11_
              (&local_38," %7d %7d %7d %11.4g %11.4g                                    ",
               this->dual_step,this->primal_step,(ulong)(uint)this->entering_variable,
               (ulong)(uint)this->leaving_variable);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pbVar1,local_38._M_dataplus._M_p,local_38._M_string_length);
  }
  else {
    pbVar1 = (this->analysis_log)._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    highsFormatToString_abi_cxx11_
              (&local_38,
               "     EnC     LvC     LvR        ThDu        ThPr        DlPr       NumCk          Aa"
              );
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(pbVar1 + 0x10),local_38._M_dataplus._M_p,local_38._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p == &local_38.field_2) {
    return;
  }
LAB_0036107d:
  operator_delete(local_38._M_dataplus._M_p);
  return;
}

Assistant:

void HighsSimplexAnalysis::reportIterationData(const bool header) {
  if (header) {
    *analysis_log << highsFormatToString(
        "     EnC     LvC     LvR        ThDu        ThPr        "
        "DlPr       NumCk          Aa");
  } else if (pivotal_row_index >= 0) {
    *analysis_log << highsFormatToString(
        " %7" HIGHSINT_FORMAT " %7" HIGHSINT_FORMAT " %7" HIGHSINT_FORMAT,
        entering_variable, leaving_variable, pivotal_row_index);
    if (entering_variable >= 0) {
      *analysis_log << highsFormatToString(
          " %11.4g %11.4g %11.4g %11.4g %11.4g", dual_step, primal_step,
          primal_delta, numerical_trouble, pivot_value_from_column);
    } else {
      // Unboundedness in dual simplex
      assert(dualAlgorithm());
      *analysis_log << highsFormatToString(
          "                         %11.4g                        ",
          primal_delta);
    }
  } else {
    // Bound swap in primal simplex
    assert(!dualAlgorithm());
    *analysis_log << highsFormatToString(
        " %7" HIGHSINT_FORMAT " %7" HIGHSINT_FORMAT " %7" HIGHSINT_FORMAT
        " %11.4g %11.4g                                    ",
        entering_variable, leaving_variable, pivotal_row_index, dual_step,
        primal_step);
  }
}